

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O2

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC::BasicRateTargetingSVC3TL3SLSimulcast
          (DatarateTestSVC *this)

{
  bool bVar1;
  int iVar2;
  ParamType *pPVar3;
  uint uVar4;
  uint uVar5;
  SEARCH_METHODS *pSVar6;
  int iVar7;
  AssertHelper local_d0;
  AssertHelper local_c8;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  int num_mismatch;
  I420VideoSource video;
  
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_optimal_sz = 500;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_sz = 1000;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_buf_initial_sz = 500;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_min_quantizer = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_max_quantizer = 0x38;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_end_usage = AOM_CBR;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_lag_in_frames = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.g_error_resilient = 0;
  (this->super_DatarateTest).super_EncoderTest.cfg_.kf_min_dist = 0x96;
  (this->super_DatarateTest).super_EncoderTest.cfg_.kf_max_dist = 0x96;
  std::__cxx11::string::string
            ((string *)&gtest_fatal_failure_checker,"hantro_collage_w352h288.yuv",
             (allocator *)&local_d0);
  libaom_test::I420VideoSource::I420VideoSource
            (&video,(string *)&gtest_fatal_failure_checker,0x160,0x120,0x1e,1,0,300);
  std::__cxx11::string::~string((string *)&gtest_fatal_failure_checker);
  pPVar3 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
           ::GetParam();
  (this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate =
       *(uint *)(&DAT_00ad4868 +
                (long)(pPVar3->
                      super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
                      ).super__Tuple_impl<1UL,_libaom_test::TestMode,_int,_unsigned_int,_int>.
                      super__Tuple_impl<2UL,_int,_unsigned_int,_int>.
                      super__Tuple_impl<3UL,_unsigned_int,_int>.super__Tuple_impl<4UL,_int>.
                      super__Head_base<4UL,_int,_false>._M_head_impl * 4);
  (*(this->super_CodecTestWith4Params<libaom_test::TestMode,_int,_unsigned_int,_int>).
    super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
    .super_Test._vptr_Test[8])(this);
  this->simulcast_mode_ = 1;
  uVar4 = (this->super_DatarateTest).super_EncoderTest.cfg_.rc_target_bitrate;
  this->frame_to_start_decoding_ = (this->super_DatarateTest).super_EncoderTest.cfg_.kf_max_dist;
  this->layer_to_decode_ = 2;
  this->number_temporal_layers_ = 3;
  this->number_spatial_layers_ = 3;
  this->target_layer_bitrate_[0] = uVar4 >> 4;
  this->target_layer_bitrate_[1] = ((uVar4 >> 3) * 0x46) / 100;
  this->target_layer_bitrate_[2] = uVar4 >> 3;
  uVar5 = uVar4 * 3 >> 3;
  this->target_layer_bitrate_[3] = uVar4 * 3 >> 4;
  this->target_layer_bitrate_[4] = (uVar5 * 0x46) / 100;
  this->target_layer_bitrate_[5] = uVar5;
  uVar4 = uVar4 >> 1 & 0x1fffffff;
  this->target_layer_bitrate_[6] = uVar4 >> 1;
  this->target_layer_bitrate_[7] = (uVar4 * 0x46) / 100;
  this->target_layer_bitrate_[8] = uVar4;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (*(this->super_DatarateTest).super_EncoderTest._vptr_EncoderTest[2])
                (&this->super_DatarateTest,&video);
    }
    bVar1 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar1 == false) {
      for (iVar7 = 0; iVar7 < this->number_temporal_layers_; iVar7 = iVar7 + 1) {
        iVar2 = this->number_temporal_layers_ * this->layer_to_decode_ + iVar7;
        local_d0.data_ = (AssertHelperData *)((double)this->target_layer_bitrate_[iVar2] * 0.6);
        testing::internal::CmpHelperGE<double,double>
                  ((internal *)&gtest_fatal_failure_checker,"effective_datarate_tl[i]",
                   "target_layer_bitrate_[i] * 0.6",this->effective_datarate_tl + iVar2,
                   (double *)&local_d0);
        if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface == '\0') {
          testing::Message::Message((Message *)&local_d0);
          std::operator<<((ostream *)&(local_d0.data_)->line,
                          " The datarate for the file is lower than target by too much!");
          if ((undefined8 *)
              CONCAT71(gtest_fatal_failure_checker._9_7_,
                       gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
            pSVar6 = "";
          }
          else {
            pSVar6 = *(SEARCH_METHODS **)
                      CONCAT71(gtest_fatal_failure_checker._9_7_,
                               gtest_fatal_failure_checker.has_new_fatal_failure_);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
                     ,0x66c,(char *)pSVar6);
          testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
          testing::internal::AssertHelper::~AssertHelper(&local_c8);
          if (local_d0.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_d0.data_ + 8))();
          }
          goto LAB_0059b942;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
        local_d0.data_ = (AssertHelperData *)((double)this->target_layer_bitrate_[iVar2] * 1.7);
        testing::internal::CmpHelperLE<double,double>
                  ((internal *)&gtest_fatal_failure_checker,"effective_datarate_tl[i]",
                   "target_layer_bitrate_[i] * 1.7",this->effective_datarate_tl + iVar2,
                   (double *)&local_d0);
        if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface == '\0') {
          testing::Message::Message((Message *)&local_d0);
          std::operator<<((ostream *)&(local_d0.data_)->line,
                          " The datarate for the file is greater than target by too much!");
          if ((undefined8 *)
              CONCAT71(gtest_fatal_failure_checker._9_7_,
                       gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
            pSVar6 = "";
          }
          else {
            pSVar6 = *(SEARCH_METHODS **)
                      CONCAT71(gtest_fatal_failure_checker._9_7_,
                               gtest_fatal_failure_checker.has_new_fatal_failure_);
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_c8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
                     ,0x66e,(char *)pSVar6);
          testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
          testing::internal::AssertHelper::~AssertHelper(&local_c8);
          if (local_d0.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_d0.data_ + 8))();
          }
          goto LAB_0059b942;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
      }
      num_mismatch = 300 - this->frame_to_start_decoding_ >> 1;
      local_d0.data_._0_4_ = this->mismatch_nframes_;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_fatal_failure_checker,"(int)GetMismatchFrames()","num_mismatch",
                 (int *)&local_d0,&num_mismatch);
      if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                _vptr_TestPartResultReporterInterface == '\0') {
        testing::Message::Message((Message *)&local_d0);
        if ((undefined8 *)
            CONCAT71(gtest_fatal_failure_checker._9_7_,
                     gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
          pSVar6 = "";
        }
        else {
          pSVar6 = *(SEARCH_METHODS **)
                    CONCAT71(gtest_fatal_failure_checker._9_7_,
                             gtest_fatal_failure_checker.has_new_fatal_failure_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
                   ,0x676,(char *)pSVar6);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        if (local_d0.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_d0.data_ + 8))();
        }
      }
LAB_0059b942:
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
      goto LAB_0059b94c;
    }
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_d0,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/svc_datarate_test.cc"
             ,0x668,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_d0,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_d0);
  if ((long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                       _vptr_TestPartResultReporterInterface._1_7_,
                       (char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                             _vptr_TestPartResultReporterInterface) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface
                                   ._vptr_TestPartResultReporterInterface._1_7_,
                                   (char)gtest_fatal_failure_checker.
                                         super_TestPartResultReporterInterface.
                                         _vptr_TestPartResultReporterInterface) + 8))();
  }
LAB_0059b94c:
  libaom_test::YUVVideoSource::~YUVVideoSource(&video.super_YUVVideoSource);
  return;
}

Assistant:

virtual void BasicRateTargetingSVC3TL3SLSimulcast() {
    cfg_.rc_buf_initial_sz = 500;
    cfg_.rc_buf_optimal_sz = 500;
    cfg_.rc_buf_sz = 1000;
    cfg_.rc_dropframe_thresh = 0;
    cfg_.rc_min_quantizer = 0;
    cfg_.rc_max_quantizer = 56;
    cfg_.rc_end_usage = AOM_CBR;
    cfg_.g_lag_in_frames = 0;
    cfg_.g_error_resilient = 0;
    cfg_.kf_max_dist = 150;
    cfg_.kf_min_dist = 150;
    int num_frames = 300;
    ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352,
                                         288, 30, 1, 0, num_frames);
    const int bitrate_array[2] = { 500, 1000 };
    cfg_.rc_target_bitrate = bitrate_array[GET_PARAM(4)];
    ResetModel();
    simulcast_mode_ = 1;
    frame_to_start_decoding_ = cfg_.kf_max_dist;
    layer_to_decode_ = 2;  // SL2
    number_temporal_layers_ = 3;
    number_spatial_layers_ = 3;
    // SL0
    const int bitrate_sl0 = 1 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[0] = 50 * bitrate_sl0 / 100;
    target_layer_bitrate_[1] = 70 * bitrate_sl0 / 100;
    target_layer_bitrate_[2] = bitrate_sl0;
    // SL1
    const int bitrate_sl1 = 3 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[3] = 50 * bitrate_sl1 / 100;
    target_layer_bitrate_[4] = 70 * bitrate_sl1 / 100;
    target_layer_bitrate_[5] = bitrate_sl1;
    // SL2
    const int bitrate_sl2 = 4 * cfg_.rc_target_bitrate / 8;
    target_layer_bitrate_[6] = 50 * bitrate_sl2 / 100;
    target_layer_bitrate_[7] = 70 * bitrate_sl2 / 100;
    target_layer_bitrate_[8] = bitrate_sl2;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    // Only SL2 layer is decoded.
    for (int tl = 0; tl < number_temporal_layers_; tl++) {
      int i = layer_to_decode_ * number_temporal_layers_ + tl;
      ASSERT_GE(effective_datarate_tl[i], target_layer_bitrate_[i] * 0.6)
          << " The datarate for the file is lower than target by too much!";
      ASSERT_LE(effective_datarate_tl[i], target_layer_bitrate_[i] * 1.7)
          << " The datarate for the file is greater than target by too much!";
    }
#if CONFIG_AV1_DECODER
    // Only top spatial layer (SL2) is decoded, starting at frame 150
    // (frame_to_start_decoding_), so there (300 - 150) / 2 = 75
    // non-reference frames, so mismatch is 75.
    int num_mismatch = (num_frames - frame_to_start_decoding_) / 2;
    EXPECT_EQ((int)GetMismatchFrames(), num_mismatch);
#endif
  }